

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

void ValueArgumentExtracterStream(string *argument,int value_start_position,double *value)

{
  _Ios_Openmode _Var1;
  exception e;
  double a;
  stringstream temp_stream;
  string local_40 [8];
  string temp_argument;
  double *value_local;
  int value_start_position_local;
  string *argument_local;
  
  temp_argument.field_2._8_8_ = value;
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_40,(ulong)argument);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&a,local_40,_Var1);
  std::istream::operator>>((istream *)&a,(double *)&e);
  *(undefined8 *)temp_argument.field_2._8_8_ = _e;
  std::__cxx11::stringstream::~stringstream((stringstream *)&a);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ValueArgumentExtracterStream(const string &argument, int value_start_position, double &value)
{
  try{
    string temp_argument = argument.substr(value_start_position, argument.length() - value_start_position);
    stringstream temp_stream(temp_argument);
    double a;
    temp_stream >> a;
    value = a;
  }
  catch (exception e)
  {
    return;
  }
}